

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

void __thiscall
VarSymbol::VarSymbol
          (VarSymbol *this,int lexemeIndex,int scope,char *lexemeScope,TypeNode *type,bool pointer,
          int arraySize,bool parameter)

{
  (this->super_Symbol).lexemeIndex = lexemeIndex;
  (this->super_Symbol).lexemeScope = lexemeScope;
  (this->super_Symbol).scope = scope;
  (this->super_Symbol).nextSymbol = (Symbol *)0x0;
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR__VarSymbol_00124130;
  this->type = type;
  this->pointer = pointer;
  this->arraySize = arraySize;
  this->parameter = parameter;
  this->offset = 0;
  this->size = 0;
  return;
}

Assistant:

VarSymbol::VarSymbol(int lexemeIndex, int scope, const char *lexemeScope, TypeNode *type,
                     bool pointer, int arraySize, bool parameter) : Symbol(lexemeIndex, scope, lexemeScope) {
    this->type = type;
    this->pointer = pointer;
    this->arraySize = arraySize;
    this->parameter = parameter;

    this->offset = 0;
    this->size = 0;
}